

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  double dVar3;
  bool bVar4;
  N_Vector yp;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined8 *puVar9;
  N_Vector p_Var10;
  N_Vector p_Var11;
  void *ida_mem;
  long *plVar12;
  long *plVar13;
  long lVar14;
  size_t sVar15;
  FILE *__stream;
  N_Vector *ypS;
  N_Vector *yS;
  char *pcVar16;
  undefined4 uVar17;
  SUNContext ctx;
  sunrealtype t;
  char fname [256];
  undefined8 local_1c8;
  N_Vector local_1c0;
  undefined8 *local_1b8;
  N_Vector local_1b0;
  double local_1a8;
  sunrealtype local_1a0;
  long *local_198;
  undefined8 *local_190;
  N_Vector local_188;
  long *local_180;
  long local_178;
  long local_170;
  long *local_168;
  void *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char local_138 [8];
  undefined8 uStack_130;
  undefined2 uStack_128;
  char acStack_126 [246];
  
  if (argc < 2) {
LAB_00103018:
    WrongArgs(*argv);
  }
  pcVar16 = argv[1];
  iVar5 = strcmp(pcVar16,"-nosensi");
  uVar17 = 0;
  bVar4 = true;
  if (iVar5 == 0) {
    iVar6 = -1;
  }
  else {
    iVar6 = strcmp(pcVar16,"-sensi");
    if ((iVar6 != 0) || (argc != 4)) goto LAB_00103018;
    pcVar16 = argv[2];
    iVar6 = strcmp(pcVar16,"sim");
    if (iVar6 == 0) {
      iVar6 = 1;
    }
    else {
      iVar7 = strcmp(pcVar16,"stg");
      iVar6 = 2;
      if (iVar7 != 0) goto LAB_00103018;
    }
    pcVar16 = argv[3];
    if (*pcVar16 == 'f') {
      uVar17 = 0;
      if (pcVar16[1] != '\0') goto LAB_00103018;
    }
    else {
      if ((*pcVar16 != 't') || (pcVar16[1] != '\0')) goto LAB_00103018;
      bVar4 = false;
      uVar17 = 1;
    }
  }
  uVar8 = SUNContext_Create(0,&local_1c8);
  if ((int)uVar8 < 0) {
    pcVar16 = "SUNContext_Create";
  }
  else {
    puVar9 = (undefined8 *)malloc(0x20);
    if (puVar9 == (undefined8 *)0x0) {
      main_cold_8();
      return 1;
    }
    *puVar9 = 0x3fa47ae147ae147b;
    puVar9[1] = 0x40c3880000000000;
    *(undefined4 *)(puVar9 + 2) = 0;
    *(undefined4 *)((long)puVar9 + 0x14) = 0x417c9c38;
    *(undefined4 *)(puVar9 + 3) = 0;
    *(undefined4 *)((long)puVar9 + 0x1c) = 0x3fe00000;
    p_Var10 = (N_Vector)N_VNew_Serial(3,local_1c8);
    if (p_Var10 == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)p_Var10->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    p_Var11 = (N_Vector)N_VClone(p_Var10);
    if (p_Var11 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    local_1a8 = (double)CONCAT44(local_1a8._4_4_,uVar17);
    puVar1 = *(undefined8 **)((long)p_Var11->content + 0x10);
    *puVar1 = 0x3fb999999999999a;
    puVar1[1] = 0;
    puVar1[2] = 0;
    ida_mem = (void *)IDACreate(local_1c8);
    local_160 = ida_mem;
    if (ida_mem == (void *)0x0) {
      main_cold_5();
      return 1;
    }
    local_1b0 = p_Var11;
    uVar8 = IDAInit(0,ida_mem,res,p_Var10,p_Var11);
    if ((int)uVar8 < 0) {
      pcVar16 = "IDAInit";
    }
    else {
      plVar12 = (long *)N_VClone(p_Var10);
      puVar1 = *(undefined8 **)(*plVar12 + 0x10);
      *puVar1 = 0x3e45798ee2308c3a;
      puVar1[1] = 0x3d06849b86a12b9b;
      ypS = (N_Vector *)0x3eb0c6f7a0b5ed8d;
      puVar1[2] = 0x3eb0c6f7a0b5ed8d;
      uVar8 = IDASVtolerances(0xa0b5ed8d,ida_mem,plVar12);
      if ((int)uVar8 < 0) {
        pcVar16 = "IDASVtolerances";
      }
      else {
        plVar13 = (long *)N_VClone(p_Var10);
        puVar2 = *(undefined4 **)(*plVar13 + 0x10);
        *puVar2 = 0;
        puVar2[1] = 0x3ff00000;
        puVar2[2] = 0;
        puVar2[3] = 0x3ff00000;
        *(undefined8 *)(puVar2 + 4) = 0;
        uVar8 = IDASetId(ida_mem,plVar13);
        if ((int)uVar8 < 0) {
          pcVar16 = "IDASetId";
        }
        else {
          uVar8 = IDASetUserData(ida_mem,puVar9);
          if ((int)uVar8 < 0) {
            pcVar16 = "IDASetUserData";
          }
          else {
            lVar14 = SUNDenseMatrix(3,3,local_1c8);
            if (lVar14 == 0) {
              main_cold_4();
              return 1;
            }
            local_168 = plVar13;
            local_178 = SUNLinSol_Dense(p_Var10,lVar14,local_1c8);
            if (local_178 == 0) {
              main_cold_3();
              return 1;
            }
            local_170 = lVar14;
            uVar8 = IDASetLinearSolver(ida_mem,local_178,lVar14);
            if ((int)uVar8 < 0) {
              pcVar16 = "IDASetLinearSolver";
            }
            else {
              puts("\n3-species chemical kinetics problem");
              local_1c0 = p_Var10;
              if (iVar5 == 0) {
                p_Var10 = (N_Vector)0x0;
                pcVar16 = "Sensitivity: NO ";
                p_Var11 = (N_Vector)0x0;
              }
              else {
                local_158 = *puVar9;
                uStack_150 = puVar9[1];
                local_148 = puVar9[2];
                p_Var10 = (N_Vector)N_VCloneVectorArray(3,p_Var10);
                if (p_Var10 == (N_Vector)0x0) {
                  main_cold_2();
                  return 1;
                }
                lVar14 = 0;
                do {
                  N_VConst(0,(&p_Var10->content)[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                p_Var11 = (N_Vector)N_VCloneVectorArray(3,local_1c0);
                if (p_Var11 == (N_Vector)0x0) {
                  main_cold_1();
                  return 1;
                }
                lVar14 = 0;
                do {
                  N_VConst(0,(&p_Var11->content)[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                uVar8 = IDASensInit(ida_mem,3,iVar6,resS,p_Var10,p_Var11);
                if ((int)uVar8 < 0) {
                  pcVar16 = "IDASensInit";
                  goto LAB_00102fce;
                }
                uVar8 = IDASensEEtolerances(ida_mem);
                if ((int)uVar8 < 0) {
                  pcVar16 = "IDASensEEtolerances";
                  goto LAB_00102fce;
                }
                uVar8 = IDASetSensErrCon(ida_mem,(ulong)local_1a8 & 0xffffffff);
                if ((int)uVar8 < 0) {
                  pcVar16 = "IDASetSensErrCon";
                  goto LAB_00102fce;
                }
                ypS = (N_Vector *)0x0;
                uVar8 = IDASetSensParams(ida_mem,puVar9,&local_158);
                if ((int)uVar8 < 0) {
                  pcVar16 = "IDASetSensParams";
                  goto LAB_00102fce;
                }
                printf("Sensitivity: YES ");
                pcVar16 = "( STAGGERED +";
                if (iVar6 == 1) {
                  pcVar16 = "( SIMULTANEOUS +";
                }
                printf(pcVar16);
                pcVar16 = " FULL ERROR CONTROL )";
                if (bVar4) {
                  pcVar16 = " PARTIAL ERROR CONTROL )";
                }
              }
              local_188 = p_Var11;
              printf(pcVar16);
              plVar13 = (long *)N_VNew_Serial(2,local_1c8);
              puVar1 = *(undefined8 **)(*plVar13 + 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              IDAQuadInit(ida_mem,rhsQ,plVar13);
              local_180 = plVar13;
              if (iVar5 == 0) {
                local_1b8 = (undefined8 *)0x0;
              }
              else {
                local_1b8 = (undefined8 *)N_VCloneVectorArray(3,plVar13);
                lVar14 = 0;
                do {
                  N_VConst(0,local_1b8[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                IDAQuadSensInit(ida_mem,0,local_1b8);
              }
              uVar8 = IDACalcIC(0x9999999a,ida_mem,1);
              yp = local_1b0;
              p_Var11 = local_1c0;
              if ((int)uVar8 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDACalcIC",
                        (ulong)uVar8);
                return 1;
              }
              uVar8 = IDAGetConsistentIC(ida_mem,local_1c0,local_1b0);
              if (-1 < (int)uVar8) {
                local_198 = plVar12;
                local_190 = puVar9;
                PrintIC(p_Var11,yp);
                p_Var11 = local_188;
                if (iVar5 != 0) {
                  IDAGetSensConsistentIC(ida_mem,p_Var10,local_188);
                  PrintSensIC(p_Var10,p_Var11,yS,ypS);
                }
                puts("\n");
                printf("===========================================");
                puts("============================");
                printf("     T     Q       H      NST           y1");
                puts("           y2           y3    ");
                printf("===========================================");
                puts("============================");
                iVar7 = 0xc;
                dVar3 = 0.4;
                do {
                  p_Var11 = local_1c0;
                  local_1a8 = dVar3;
                  uVar8 = IDASolve(ida_mem,&local_1a0,local_1c0,local_1b0,1);
                  if ((int)uVar8 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDASolve",
                            (ulong)uVar8);
                    break;
                  }
                  PrintOutput(ida_mem,local_1a0,p_Var11);
                  if (iVar5 != 0) {
                    uVar8 = IDAGetSens(ida_mem,&local_1a0,p_Var10);
                    if ((int)uVar8 < 0) {
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                              "IDAGetSens",(ulong)uVar8);
                      break;
                    }
                    PrintSensOutput((N_Vector *)p_Var10);
                  }
                  printf("-----------------------------------------");
                  puts("------------------------------");
                  dVar3 = local_1a8 * 10.0;
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
                puts("\nQuadrature:");
                plVar12 = local_180;
                IDAGetQuad(ida_mem,&local_1a0,local_180);
                printf("G:      %10.4e\n",(int)**(undefined8 **)(*plVar12 + 0x10));
                puVar9 = local_1b8;
                if (iVar5 == 0) {
                  puts("\nFinal Statistics:");
                  IDAPrintAllStats(ida_mem,_stdout,0);
                  builtin_strncpy(local_138,"idasRobe",8);
                  uStack_130._0_2_ = 0x7472;
                  uStack_130._2_6_ = 0x5f4153465f73;
                  uStack_128 = 0x6e64;
                  builtin_strncpy(acStack_126,"s_stats",8);
                  puVar9 = local_190;
                  plVar13 = local_198;
                }
                else {
                  IDAGetQuadSens(ida_mem,&local_1a0,local_1b8);
                  printf("\nSensitivities at t=%g:\n",local_1a0._0_4_);
                  printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)*puVar9 + 0x10));
                  printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar9[1] + 0x10));
                  printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar9[2] + 0x10));
                  puts("\nFinal Statistics:");
                  IDAPrintAllStats(ida_mem,_stdout,0);
                  builtin_strncpy(local_138,"idasRobe",8);
                  uStack_130._0_2_ = 0x7472;
                  uStack_130._2_6_ = 0x5f4153465f73;
                  uStack_128 = 0x6e64;
                  builtin_strncpy(acStack_126,"s_stats",8);
                  sVar15 = strlen(local_138);
                  puVar9 = local_190;
                  plVar13 = local_198;
                  if (iVar6 == 1) {
                    builtin_strncpy(local_138 + sVar15,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar15) = 0x6d6973;
                  }
                  else {
                    builtin_strncpy(local_138 + sVar15,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar15) = 0x677473;
                  }
                  sVar15 = strlen(local_138);
                  pcVar16 = local_138 + sVar15;
                  if (bVar4) {
                    local_138[sVar15 + 2] = '\0';
                    pcVar16[0] = '_';
                    pcVar16[1] = 'f';
                  }
                  else {
                    local_138[sVar15 + 2] = '\0';
                    pcVar16[0] = '_';
                    pcVar16[1] = 't';
                  }
                }
                sVar15 = strlen(local_138);
                builtin_strncpy(local_138 + sVar15,".csv",5);
                __stream = fopen(local_138,"w");
                IDAPrintAllStats(ida_mem,__stream,1);
                fclose(__stream);
                N_VDestroy(local_1c0);
                N_VDestroy(local_1b0);
                N_VDestroy(plVar13);
                N_VDestroy(local_168);
                N_VDestroy(plVar12);
                if (iVar5 != 0) {
                  N_VDestroyVectorArray(p_Var10,3);
                  N_VDestroyVectorArray(local_188,3);
                  N_VDestroyVectorArray(local_1b8,3);
                }
                free(puVar9);
                IDAFree(&local_160);
                SUNLinSolFree(local_178);
                SUNMatDestroy(local_170);
                SUNContext_Free(&local_1c8);
                return 0;
              }
              pcVar16 = "IDAGetConsistentIC";
            }
          }
        }
      }
    }
  }
LAB_00102fce:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar16,(ulong)uVar8);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;
  void* ida_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype reltol, t, tout;
  N_Vector y, yp, abstol, id;
  int iout, retval;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector *yS, *ypS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  N_Vector yQ, *yQS;

  ida_mem = NULL;
  A       = NULL;
  LS      = NULL;
  data    = NULL;
  y       = NULL;
  yS      = NULL;
  ypS     = NULL;
  yQS     = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.040);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);
  data->coef = SUN_RCONST(0.5);

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  Ith(y, 1) = ONE;
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  yp = N_VClone(y);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* These initial conditions are NOT consistent. See IDACalcIC below. */
  Ith(yp, 1) = SUN_RCONST(0.1);
  Ith(yp, 2) = ZERO;
  Ith(yp, 3) = ZERO;

  /* Create IDAS object */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  /* Allocate space for IDAS */
  retval = IDAInit(ida_mem, res, T0, y, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Specify scalar relative tol. and vector absolute tol. */
  reltol         = SUN_RCONST(1.0e-6);
  abstol         = N_VClone(y);
  Ith(abstol, 1) = SUN_RCONST(1.0e-8);
  Ith(abstol, 2) = SUN_RCONST(1.0e-14);
  Ith(abstol, 3) = SUN_RCONST(1.0e-6);
  retval         = IDASVtolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Set ID vector */
  id         = N_VClone(y);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;
  retval     = IDASetId(ida_mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  /* Attach user data */
  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  printf("\n3-species chemical kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    ypS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)ypS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, ypS[is]); }

    /*
    * Only non-zero sensitivity I.C. are ypS[0]:
    * - Ith(ypS[0],1) = -ONE;
    * - Ith(ypS[0],2) =  ONE;
    *
    * They are not set. IDACalcIC also computes consistent IC for sensitivities.
    */

    retval = IDASensInit(ida_mem, NS, sensi_meth, resS, yS, ypS);
    if (check_retval(&retval, "IDASensInit", 1)) { return (1); }

    retval = IDASensEEtolerances(ida_mem);
    if (check_retval(&retval, "IDASensEEtolerances", 1)) { return (1); }

    retval = IDASetSensErrCon(ida_mem, err_con);
    if (check_retval(&retval, "IDASetSensErrCon", 1)) { return (1); }

    retval = IDASetSensParams(ida_mem, data->p, pbar, NULL);
    if (check_retval(&retval, "IDASetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == IDA_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else { printf("( STAGGERED +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /*----------------------------------------------------------
   *               Q U A D R A T U R E S
   * ---------------------------------------------------------*/
  yQ = N_VNew_Serial(2, ctx);

  Ith(yQ, 1) = 0;
  Ith(yQ, 2) = 0;

  IDAQuadInit(ida_mem, rhsQ, yQ);

  if (sensi)
  {
    yQS = N_VCloneVectorArray(NS, yQ);
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yQS[is]); }

    IDAQuadSensInit(ida_mem, NULL, yQS);
  }

  /* Call IDACalcIC to compute consistent initial conditions. If sensitivity is
     enabled, this function also try to find consistent IC for the sensitivities. */

  retval = IDACalcIC(ida_mem, IDA_YA_YDP_INIT, T1);
  ;
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  retval = IDAGetConsistentIC(ida_mem, y, yp);
  if (check_retval(&retval, "IDAGetConsistentIC", 1)) { return (1); }

  PrintIC(y, yp);

  if (sensi)
  {
    IDAGetSensConsistentIC(ida_mem, yS, ypS);
    PrintSensIC(y, yp, yS, ypS);
  }

  /* In loop over output points, call IDA, print results, test for error */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = IDASolve(ida_mem, tout, &t, y, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { break; }

    PrintOutput(ida_mem, t, y);

    if (sensi)
    {
      retval = IDAGetSens(ida_mem, &t, yS);
      if (check_retval(&retval, "IDAGetSens", 1)) { break; }
      PrintSensOutput(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  printf("\nQuadrature:\n");
  IDAGetQuad(ida_mem, &t, yQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:      %10.4Le\n", Ith(yQ, 1));
#else
  printf("G:      %10.4e\n", Ith(yQ, 1));
#endif

  if (sensi)
  {
    IDAGetQuadSens(ida_mem, &t, yQS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("\nSensitivities at t=%Lg:\n", t);
    printf("dG/dp1: %11.4Le\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[2], 1));
#else
    printf("\nSensitivities at t=%g:\n", t);
    printf("dG/dp1: %11.4e\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[2], 1));
#endif
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "idasRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == IDA_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else { strcat(fname, "_-sensi_stg"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(yp);
  N_VDestroy(abstol);
  N_VDestroy(id);
  N_VDestroy(yQ);
  if (sensi)
  {
    N_VDestroyVectorArray(yS, NS);
    N_VDestroyVectorArray(ypS, NS);
    N_VDestroyVectorArray(yQS, NS);
  }
  free(data);
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNContext_Free(&ctx);

  return (0);
}